

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase915::run(TestCase915 *this)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  SourceLocation location_02;
  PromiseBase PVar2;
  OwnPromiseNode OVar3;
  bool bVar4;
  void *pvVar5;
  TransformPromiseNodeBase *this_00;
  Exception *e;
  StringPtr cancelReason;
  DebugExpression<bool> _kjCondition_5;
  Canceler canceler;
  Promise<unsigned_int> nowI;
  Promise<unsigned_int> neverI;
  Promise<void> now;
  Promise<void> never;
  WaitScope waitScope;
  DebugExpression<bool> _kjCondition_4;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_6;
  DebugExpression<bool> _kjCondition;
  EventLoop loop;
  Canceler local_648;
  PromiseBase local_640;
  PromiseBase local_638;
  PromiseBase local_630;
  OwnPromiseNode local_628;
  WaitScope local_620;
  PromiseBase local_600;
  OwnPromiseNode local_5f8;
  PromiseBase local_5f0;
  PromiseBase local_5e8;
  char *local_5e0;
  char *pcStack_5d8;
  undefined8 local_5d0;
  char *local_5c8;
  char *pcStack_5c0;
  undefined8 local_5b8;
  char *local_5b0;
  char *pcStack_5a8;
  undefined8 local_5a0;
  char *local_598;
  char *pcStack_590;
  undefined8 local_588;
  OwnPromiseNode local_570;
  undefined1 auStack_568 [400];
  OwnPromiseNode local_3d8 [51];
  EventLoop local_240 [4];
  
  EventLoop::EventLoop(local_240);
  local_620.busyPollInterval = 0xffffffff;
  local_620.fiber.ptr = (FiberBase *)0x0;
  local_620.runningStacksPool.ptr = (FiberPool *)0x0;
  local_620.loop = local_240;
  EventLoop::enterScope(local_240);
  local_648.list.ptr = (Maybe<kj::Canceler::AdapterBase_&>)(AdapterBase *)0x0;
  kj::_::neverDone();
  local_5e8.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_570.ptr;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<void>>
            ((PromiseDisposer *)&local_628,&local_648,(Promise<void> *)&local_5e8);
  PVar2.node.ptr = local_5e8.node.ptr;
  if (local_5e8.node.ptr != (PromiseNode *)0x0) {
    local_5e8.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar2.node.ptr);
  }
  kj::_::readyNow();
  local_5f0.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_570.ptr;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<void>>
            ((PromiseDisposer *)&local_630,&local_648,(Promise<void> *)&local_5f0);
  PVar2.node.ptr = local_5f0.node.ptr;
  if (local_5f0.node.ptr != (PromiseNode *)0x0) {
    local_5f0.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar2.node.ptr);
  }
  kj::_::neverDone();
  OVar3.ptr = local_570.ptr;
  local_3d8[0].ptr = local_570.ptr;
  pPVar1 = *(PromiseArena **)((long)local_570.ptr + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_570.ptr - (long)pPVar1) < 0x28) {
    pvVar5 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,local_3d8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:922:70)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_00602fb0;
    *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
  }
  else {
    *(PromiseArena **)((long)local_570.ptr + 8) = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&local_570.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,local_3d8,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:922:70)>
               ::anon_class_1_0_00000001_for_func::operator());
    OVar3.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_00602fb0;
    OVar3.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_5f8.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<unsigned_int,kj::Canceler::AdapterImpl<unsigned_int>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<unsigned_int>>
            ((PromiseDisposer *)&local_638,&local_648,(Promise<unsigned_int> *)&local_5f8);
  OVar3.ptr = local_5f8.ptr;
  if ((TransformPromiseNodeBase *)local_5f8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_5f8.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  OVar3.ptr = local_3d8[0].ptr;
  if (&(local_3d8[0].ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_3d8[0].ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  local_3d8[0].ptr._0_4_ = 0x7b;
  kj::_::PromiseDisposer::
  alloc<kj::_::ImmediatePromiseNode<unsigned_int>,kj::_::PromiseDisposer,unsigned_int>
            ((PromiseDisposer *)&local_570,(uint *)local_3d8);
  local_600.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_570.ptr;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<unsigned_int,kj::Canceler::AdapterImpl<unsigned_int>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<unsigned_int>>
            ((PromiseDisposer *)&local_640,&local_648,(Promise<unsigned_int> *)&local_600);
  PVar2.node.ptr = local_600.node.ptr;
  if (local_600.node.ptr != (PromiseNode *)0x0) {
    local_600.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar2.node.ptr);
  }
  local_570.ptr = (PromiseNode *)0x48a040;
  auStack_568._0_8_ = "run";
  auStack_568._8_8_ = 0x230000039d;
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location.lineNumber = 0x39d;
  location.columnNumber = 0x23;
  bVar4 = kj::_::pollImpl(local_628.ptr,&local_620,location);
  local_3d8[0].ptr._0_1_ = !bVar4;
  if (bVar4 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x39d,ERROR,"\"failed: expected \" \"!never.poll(waitScope)\", _kjCondition",
               (char (*) [40])"failed: expected !never.poll(waitScope)",
               (DebugExpression<bool> *)local_3d8);
  }
  local_570.ptr = (PromiseNode *)0x48a040;
  auStack_568._0_8_ = "run";
  auStack_568._8_8_ = 0x200000039e;
  location_00.function = "run";
  location_00.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_00.lineNumber = 0x39e;
  location_00.columnNumber = 0x20;
  local_3d8[0].ptr._0_1_ = kj::_::pollImpl((PromiseNode *)local_630.node.ptr,&local_620,location_00)
  ;
  if (kj::_::Debug::minSeverity < 3 && !(bool)local_3d8[0].ptr._0_1_) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x39e,ERROR,"\"failed: expected \" \"now.poll(waitScope)\", _kjCondition",
               (char (*) [37])"failed: expected now.poll(waitScope)",
               (DebugExpression<bool> *)local_3d8);
  }
  local_570.ptr = (PromiseNode *)0x48a040;
  auStack_568._0_8_ = "run";
  auStack_568._8_8_ = 0x240000039f;
  location_01.function = "run";
  location_01.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_01.lineNumber = 0x39f;
  location_01.columnNumber = 0x24;
  bVar4 = kj::_::pollImpl((PromiseNode *)local_638.node.ptr,&local_620,location_01);
  local_3d8[0].ptr._0_1_ = !bVar4;
  if (bVar4 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[41],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x39f,ERROR,"\"failed: expected \" \"!neverI.poll(waitScope)\", _kjCondition",
               (char (*) [41])"failed: expected !neverI.poll(waitScope)",
               (DebugExpression<bool> *)local_3d8);
  }
  local_570.ptr = (PromiseNode *)0x48a040;
  auStack_568._0_8_ = "run";
  auStack_568._8_8_ = 0x21000003a0;
  location_02.function = "run";
  location_02.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_02.lineNumber = 0x3a0;
  location_02.columnNumber = 0x21;
  local_3d8[0].ptr._0_1_ = kj::_::pollImpl((PromiseNode *)local_640.node.ptr,&local_620,location_02)
  ;
  if (kj::_::Debug::minSeverity < 3 && !(bool)local_3d8[0].ptr._0_1_) {
    kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x3a0,ERROR,"\"failed: expected \" \"nowI.poll(waitScope)\", _kjCondition",
               (char (*) [38])"failed: expected nowI.poll(waitScope)",
               (DebugExpression<bool> *)local_3d8);
  }
  cancelReason.content.size_ = 7;
  cancelReason.content.ptr = "foobar";
  Canceler::cancel(&local_648,cancelReason);
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_590 = "operator()";
  local_588 = 0x46000003a4;
  Promise<void>::wait((Promise<void> *)&local_628,&local_620);
  local_570.ptr = (PromiseNode *)((ulong)local_570.ptr & 0xffffffffffffff00);
  if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x3a4,ERROR,"\"code did not throw: \" \"never.wait(waitScope)\"",
               (char (*) [42])"code did not throw: never.wait(waitScope)");
  }
  if (local_570.ptr._0_1_ == (PromiseDisposer)0x1) {
    Exception::~Exception((Exception *)auStack_568);
  }
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_5a8 = "run";
  local_5a0 = 0x3000003a5;
  Promise<void>::wait((Promise<void> *)&local_630,&local_620);
  local_5e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_5d8 = "operator()";
  local_5d0 = 0x3b000003a6;
  Promise<unsigned_int>::wait((Promise<unsigned_int> *)&local_638,&local_620);
  local_570.ptr = (PromiseNode *)((ulong)local_570.ptr & 0xffffffffffffff00);
  if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[43]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x3a6,ERROR,"\"code did not throw: \" \"neverI.wait(waitScope)\"",
               (char (*) [43])"code did not throw: neverI.wait(waitScope)");
  }
  if (local_570.ptr._0_1_ == (PromiseDisposer)0x1) {
    Exception::~Exception((Exception *)auStack_568);
  }
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_5c0 = "run";
  local_5b8 = 0x29000003a7;
  local_570.ptr._0_4_ = Promise<unsigned_int>::wait((Promise<unsigned_int> *)&local_640,&local_620);
  local_570.ptr._4_4_ = 0x7b;
  auStack_568._0_8_ = " == ";
  auStack_568._8_8_ = 5;
  auStack_568[0x10] = (uint)local_570.ptr == 0x7b;
  if ((!auStack_568[0x10]) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<unsigned_int,unsigned_int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x3a7,ERROR,"\"failed: expected \" \"nowI.wait(waitScope) == 123u\", _kjCondition",
               (char (*) [46])"failed: expected nowI.wait(waitScope) == 123u",
               (DebugComparison<unsigned_int,_unsigned_int> *)&local_570);
  }
  PVar2.node.ptr = local_640.node.ptr;
  if (local_640.node.ptr != (PromiseNode *)0x0) {
    local_640.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar2.node.ptr);
  }
  PVar2.node.ptr = local_638.node.ptr;
  if (local_638.node.ptr != (PromiseNode *)0x0) {
    local_638.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar2.node.ptr);
  }
  PVar2.node.ptr = local_630.node.ptr;
  if (local_630.node.ptr != (PromiseNode *)0x0) {
    local_630.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar2.node.ptr);
  }
  OVar3.ptr = local_628.ptr;
  if (&(local_628.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_628.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
  }
  Canceler::~Canceler(&local_648);
  if (local_620.fiber.ptr == (FiberBase *)0x0) {
    EventLoop::leaveScope(local_620.loop);
  }
  EventLoop::~EventLoop(local_240);
  return;
}

Assistant:

TEST(Async, Canceler) {
  EventLoop loop;
  WaitScope waitScope(loop);
  Canceler canceler;

  auto never = canceler.wrap(kj::Promise<void>(kj::NEVER_DONE));
  auto now = canceler.wrap(kj::Promise<void>(kj::READY_NOW));
  auto neverI = canceler.wrap(kj::Promise<void>(kj::NEVER_DONE).then([]() { return 123u; }));
  auto nowI = canceler.wrap(kj::Promise<uint>(123u));

  KJ_EXPECT(!never.poll(waitScope));
  KJ_EXPECT(now.poll(waitScope));
  KJ_EXPECT(!neverI.poll(waitScope));
  KJ_EXPECT(nowI.poll(waitScope));

  canceler.cancel("foobar");

  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("foobar", never.wait(waitScope));
  now.wait(waitScope);
  KJ_EXPECT_THROW_MESSAGE("foobar", neverI.wait(waitScope));
  KJ_EXPECT(nowI.wait(waitScope) == 123u);
}